

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void lj_gc_freeall(global_State *g)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  (g->gc).currentwhite = 'C';
  gc_sweep(g,&(g->gc).root,0xffffffff);
  uVar1 = (g->str).mask;
  uVar3 = 0;
  do {
    gc_sweepstr(g,(g->str).tab + uVar3);
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 <= uVar1);
  return;
}

Assistant:

void lj_gc_freeall(global_State *g)
{
  MSize i, strmask;
  /* Free everything, except super-fixed objects (the main thread). */
  g->gc.currentwhite = LJ_GC_WHITES | LJ_GC_SFIXED;
  gc_fullsweep(g, &g->gc.root);
  strmask = g->str.mask;
  for (i = 0; i <= strmask; i++)  /* Free all string hash chains. */
    gc_sweepstr(g, &g->str.tab[i]);
}